

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O3

EStatusCode __thiscall
FreeTypeFaceWrapper::GetGlyphsForUnicodeText
          (FreeTypeFaceWrapper *this,ULongList *inUnicodeCharacters,UIntList *outGlyphs)

{
  size_t *psVar1;
  int iVar2;
  FT_UInt FVar3;
  Trace *this_00;
  _List_node_base *p_Var4;
  EStatusCode EVar5;
  _List_node_base *charcode;
  _List_node_base *p_Var6;
  
  if (this->mFace == (FT_Face)0x0) {
    EVar5 = eFailure;
  }
  else {
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::clear(outGlyphs);
    EVar5 = eSuccess;
    for (p_Var6 = (inUnicodeCharacters->
                  super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl._M_node.
                  super__List_node_base._M_next; p_Var6 != (_List_node_base *)inUnicodeCharacters;
        p_Var6 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var6->_M_next)->
                 _M_impl)._M_node.super__List_node_base._M_next) {
      if (this->mFormatParticularWrapper == (IFreeTypeFaceExtender *)0x0) {
LAB_001b440f:
        p_Var4 = p_Var6[1]._M_next;
        charcode = (_List_node_base *)((ulong)p_Var4 | 0xf000);
        if (this->mUsePUACodes == false) {
          charcode = p_Var4;
        }
        if ((_List_node_base *)0xff < p_Var4) {
          charcode = p_Var4;
        }
        FVar3 = FT_Get_Char_Index(this->mFace,(FT_ULong)charcode);
        if (FVar3 == 0) {
          this_00 = Trace::DefaultTrace();
          FVar3 = 0;
          Trace::TraceToLog(this_00,
                            "FreeTypeFaceWrapper::GetGlyphsForUnicodeText, failed to find glyph for charachter 0x%04x"
                            ,p_Var6[1]._M_next);
          EVar5 = eFailure;
        }
      }
      else {
        iVar2 = (*this->mFormatParticularWrapper->_vptr_IFreeTypeFaceExtender[0xb])();
        if ((char)iVar2 == '\0') goto LAB_001b440f;
        FVar3 = (*this->mFormatParticularWrapper->_vptr_IFreeTypeFaceExtender[0xc])
                          (this->mFormatParticularWrapper,p_Var6[1]._M_next);
      }
      p_Var4 = (_List_node_base *)operator_new(0x18);
      *(FT_UInt *)&p_Var4[1]._M_next = FVar3;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      psVar1 = &(outGlyphs->super__List_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
  }
  return EVar5;
}

Assistant:

EStatusCode FreeTypeFaceWrapper::GetGlyphsForUnicodeText(const ULongList& inUnicodeCharacters,UIntList& outGlyphs)
{
	if(mFace)
	{
		FT_UInt glyphIndex;
		EStatusCode status = PDFHummus::eSuccess;

		outGlyphs.clear();

		ULongList::const_iterator it = inUnicodeCharacters.begin();
		for(; it != inUnicodeCharacters.end(); ++it)
		{
			if ( mFormatParticularWrapper && mFormatParticularWrapper->HasPrivateEncoding() ) {
					glyphIndex = mFormatParticularWrapper->GetGlyphForUnicodeChar(*it);
				// glyphIndex == 0 is allowed in some Type1 fonts with custom encoding
			}
			else
			{
				FT_ULong charCode = *it;
				if (mUsePUACodes &&  charCode <= 0xff) // move charcode to pua are in case we should use pua and they are in plain ascii range
					charCode = 0xF000 | charCode;
				glyphIndex =  FT_Get_Char_Index(mFace,charCode);
				if(0 == glyphIndex)
				{
					TRACE_LOG1("FreeTypeFaceWrapper::GetGlyphsForUnicodeText, failed to find glyph for charachter 0x%04x",*it);
					status = PDFHummus::eFailure;
				}
			}
			outGlyphs.push_back(glyphIndex);
		}

		return status;
	}
	else
		return PDFHummus::eFailure;
}